

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

int Ivy_FastMapMerge(Ivy_Supp_t *pSupp0,Ivy_Supp_t *pSupp1,Ivy_Supp_t *pSupp,int nLimit)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  Ivy_Supp_t *pIVar12;
  long lVar13;
  
  bVar1 = pSupp0->nSize;
  uVar7 = (ulong)bVar1;
  cVar2 = pSupp1->nSize;
  uVar9 = (uint)cVar2;
  if ((char)bVar1 < cVar2) {
    __assert_fail("pSupp0->nSize >= pSupp1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                  ,0x2c6,"int Ivy_FastMapMerge(Ivy_Supp_t *, Ivy_Supp_t *, Ivy_Supp_t *, int)");
  }
  uVar8 = (uint)(char)bVar1;
  if (uVar9 == nLimit && uVar8 == nLimit) {
    if ('\0' < (char)bVar1) {
      uVar10 = 0;
      do {
        if (*(int *)(&pSupp0[1].nSize + uVar10 * 4) != *(int *)(&pSupp1[1].nSize + uVar10 * 4)) {
          return 0;
        }
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    if ('\0' < (char)bVar1) {
      uVar10 = 0;
      do {
        *(undefined4 *)(&pSupp[1].nSize + uVar10 * 4) =
             *(undefined4 *)(&pSupp0[1].nSize + uVar10 * 4);
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
  }
  else if (uVar8 == nLimit) {
    if ('\0' < cVar2) {
      uVar10 = 0;
      pIVar12 = (Ivy_Supp_t *)(&pSupp0->Delay + (ulong)uVar8 * 2);
      uVar4 = uVar8;
LAB_00750414:
      do {
        uVar5 = uVar4;
        uVar11 = (int)uVar8 >> 0x1f & uVar8;
        if (0 < (int)uVar5) {
          iVar6._0_1_ = pIVar12->nSize;
          iVar6._1_1_ = pIVar12->fMark;
          iVar6._2_1_ = pIVar12->fMark2;
          iVar6._3_1_ = pIVar12->fMark3;
          pIVar12 = (Ivy_Supp_t *)((long)(pIVar12 + 0xffffffffffffffff) + 8);
          uVar4 = uVar5 - 1;
          uVar11 = uVar5;
          if (iVar6 != *(int *)(&pSupp1[1].nSize + uVar10 * 4)) goto LAB_00750414;
        }
        if (uVar11 == 0) {
          return 0;
        }
        uVar10 = uVar10 + 1;
        pIVar12 = (Ivy_Supp_t *)(&pSupp0->Delay + (ulong)uVar8 * 2);
        uVar4 = uVar8;
      } while (uVar10 != uVar9);
    }
    if ('\0' < (char)bVar1) {
      uVar10 = 0;
      do {
        *(undefined4 *)(&pSupp[1].nSize + uVar10 * 4) =
             *(undefined4 *)(&pSupp0[1].nSize + uVar10 * 4);
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
  }
  else {
    if (nLimit < 1) {
      uVar11 = 0;
      uVar4 = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      uVar4 = 0;
      uVar11 = 0;
      do {
        if (uVar4 == uVar9) {
          if (uVar11 == uVar8) goto LAB_007504e6;
          lVar13 = (long)(int)uVar11;
          uVar11 = uVar11 + 1;
          iVar6 = *(int *)(&pSupp0[1].nSize + lVar13 * 4);
LAB_007504ae:
          *(int *)(&pSupp[1].nSize + uVar7 * 4) = iVar6;
        }
        else {
          if (uVar11 == uVar8) {
            lVar13 = (long)(int)uVar4;
            uVar4 = uVar4 + 1;
            iVar6 = *(int *)(&pSupp1[1].nSize + lVar13 * 4);
            goto LAB_007504ae;
          }
          iVar6 = *(int *)(&pSupp0[1].nSize + (long)(int)uVar11 * 4);
          iVar3 = *(int *)(&pSupp1[1].nSize + (long)(int)uVar4 * 4);
          if (iVar6 < iVar3) {
            uVar11 = uVar11 + 1;
            goto LAB_007504ae;
          }
          if (iVar3 < iVar6) {
            uVar4 = uVar4 + 1;
            *(int *)(&pSupp[1].nSize + uVar7 * 4) = iVar3;
          }
          else {
            uVar11 = uVar11 + 1;
            *(int *)(&pSupp[1].nSize + uVar7 * 4) = iVar6;
            uVar4 = uVar4 + 1;
          }
        }
        uVar7 = uVar7 + 1;
      } while ((uint)nLimit != uVar7);
    }
    if ((int)uVar11 < (int)uVar8) {
      return 0;
    }
    if ((int)uVar4 < (int)uVar9) {
      return 0;
    }
  }
LAB_007504e6:
  pSupp->nSize = (char)uVar7;
  return 1;
}

Assistant:

int Ivy_FastMapMerge( Ivy_Supp_t * pSupp0, Ivy_Supp_t * pSupp1, Ivy_Supp_t * pSupp, int nLimit )
{ 
    int i, k, c;
    assert( pSupp0->nSize >= pSupp1->nSize );
    // the case of the largest cut sizes
    if ( pSupp0->nSize == nLimit && pSupp1->nSize == nLimit )
    {
        for ( i = 0; i < pSupp0->nSize; i++ )
            if ( pSupp0->pArray[i] != pSupp1->pArray[i] )
                return 0;
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pSupp0->nSize == nLimit )
    {
        for ( i = 0; i < pSupp1->nSize; i++ )
        {
            for ( k = pSupp0->nSize - 1; k >= 0; k-- )
                if ( pSupp0->pArray[k] == pSupp1->pArray[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < nLimit; c++ )
    {
        if ( k == pSupp1->nSize )
        {
            if ( i == pSupp0->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( i == pSupp0->nSize )
        {
            if ( k == pSupp1->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        if ( pSupp0->pArray[i] < pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( pSupp0->pArray[i] > pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        pSupp->pArray[c] = pSupp0->pArray[i++]; 
        k++;
    }
    if ( i < pSupp0->nSize || k < pSupp1->nSize )
        return 0;
    pSupp->nSize = c;
    return 1;
}